

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  int iVar1;
  uchar *scratch;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  byte bVar8;
  char header [66];
  char buffer [128];
  
  bVar8 = 0;
  iVar1 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    scratch = (uchar *)malloc((ulong)(uint)(x * 4));
    pcVar4 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    pcVar5 = header;
    for (lVar2 = 0x42; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pcVar5 = *pcVar4;
      pcVar4 = pcVar4 + (ulong)bVar8 * -2 + 1;
      pcVar5 = pcVar5 + (ulong)bVar8 * -2 + 1;
    }
    (*s->func)(s->context,header,0x41);
    iVar6 = 0;
    iVar1 = sprintf(buffer,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    (*s->func)(s->context,buffer,iVar1);
    uVar3 = (ulong)(uint)y;
    while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
      stbiw__write_hdr_scanline(s,x,comp,scratch,data + iVar6);
      iVar6 = iVar6 + comp * x;
    }
    free(scratch);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*i*x);
      STBIW_FREE(scratch);
      return 1;
   }
}